

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O0

ring_buffer_size_t
PaUtil_ReadRingBuffer(PaUtilRingBuffer *rbuf,void *data,ring_buffer_size_t elementCount)

{
  void *local_48;
  void *data2;
  void *data1;
  ring_buffer_size_t numRead;
  ring_buffer_size_t size2;
  ring_buffer_size_t size1;
  ring_buffer_size_t elementCount_local;
  void *data_local;
  PaUtilRingBuffer *rbuf_local;
  
  size1 = elementCount;
  elementCount_local = (ring_buffer_size_t)data;
  data_local = rbuf;
  data1 = (void *)PaUtil_GetRingBufferReadRegions
                            (rbuf,elementCount,&data2,&size2,&local_48,&numRead);
  if (numRead < 1) {
    memcpy((void *)elementCount_local,data2,size2 * *(long *)((long)data_local + 0x28));
  }
  else {
    memcpy((void *)elementCount_local,data2,size2 * *(long *)((long)data_local + 0x28));
    elementCount_local = elementCount_local + size2 * *(long *)((long)data_local + 0x28);
    memcpy((void *)elementCount_local,local_48,numRead * *(long *)((long)data_local + 0x28));
  }
  PaUtil_AdvanceRingBufferReadIndex((PaUtilRingBuffer *)data_local,(ring_buffer_size_t)data1);
  return (ring_buffer_size_t)data1;
}

Assistant:

ring_buffer_size_t PaUtil_ReadRingBuffer( PaUtilRingBuffer *rbuf, void *data, ring_buffer_size_t elementCount )
{
    ring_buffer_size_t size1, size2, numRead;
    void *data1, *data2;
    numRead = PaUtil_GetRingBufferReadRegions( rbuf, elementCount, &data1, &size1, &data2, &size2 );
    if( size2 > 0 )
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
        data = ((char *)data) + size1*rbuf->elementSizeBytes;
        memcpy( data, data2, size2*rbuf->elementSizeBytes );
    }
    else
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
    }
    PaUtil_AdvanceRingBufferReadIndex( rbuf, numRead );
    return numRead;
}